

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O0

bool __thiscall
sf::priv::ImageLoader::loadImageFromMemory
          (ImageLoader *this,void *data,size_t dataSize,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  stbi_uc *psVar1;
  ostream *poVar2;
  char *pcVar3;
  long in_RDX;
  long in_RSI;
  undefined4 *in_R8;
  uchar *ptr;
  uchar *buffer;
  int channels;
  int height;
  int width;
  int in_stack_0000007c;
  int *in_stack_00000080;
  int *in_stack_00000088;
  int *in_stack_00000090;
  int in_stack_0000009c;
  stbi_uc *in_stack_000000a0;
  bool local_1;
  
  if ((in_RSI == 0) || (in_RDX == 0)) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to load image from memory, no data provided");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2d60cf);
    psVar1 = stbi_load_from_memory
                       (in_stack_000000a0,in_stack_0000009c,in_stack_00000090,in_stack_00000088,
                        in_stack_00000080,in_stack_0000007c);
    if (psVar1 == (stbi_uc *)0x0) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to load image from memory. Reason: ");
      pcVar3 = stbi_failure_reason();
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
    else {
      *in_R8 = 0;
      in_R8[1] = 0;
      stbi_image_free((void *)0x2d61a9);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ImageLoader::loadImageFromMemory(const void* data, std::size_t dataSize, std::vector<Uint8>& pixels, Vector2u& size)
{
    // Check input parameters
    if (data && dataSize)
    {
        // Clear the array (just in case)
        pixels.clear();

        // Load the image and get a pointer to the pixels in memory
        int width = 0;
        int height = 0;
        int channels = 0;
        const unsigned char* buffer = static_cast<const unsigned char*>(data);
        unsigned char* ptr = stbi_load_from_memory(buffer, static_cast<int>(dataSize), &width, &height, &channels, STBI_rgb_alpha);

        if (ptr)
        {
            // Assign the image properties
            size.x = static_cast<unsigned int>(width);
            size.y = static_cast<unsigned int>(height);

            if (width > 0 && height > 0)
            {
                // Copy the loaded pixels to the pixel buffer
                pixels.resize(static_cast<std::size_t>(width * height * 4));
                memcpy(&pixels[0], ptr, pixels.size());
            }

            // Free the loaded pixels (they are now in our own pixel buffer)
            stbi_image_free(ptr);

            return true;
        }
        else
        {
            // Error, failed to load the image
            err() << "Failed to load image from memory. Reason: " << stbi_failure_reason() << std::endl;

            return false;
        }
    }
    else
    {
        err() << "Failed to load image from memory, no data provided" << std::endl;
        return false;
    }
}